

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_label.c
# Opt level: O0

void HTS_Label_load_from_fn(HTS_Label *label,size_t sampling_rate,size_t fperiod,char *fn)

{
  HTS_File *in_RCX;
  char *in_RDX;
  HTS_File *fp;
  HTS_File *in_stack_000003f8;
  size_t in_stack_00000400;
  size_t in_stack_00000408;
  HTS_Label *in_stack_00000410;
  
  HTS_fopen_from_fn(in_RDX,(char *)in_RCX);
  HTS_Label_load(in_stack_00000410,in_stack_00000408,in_stack_00000400,in_stack_000003f8);
  HTS_fclose(in_RCX);
  return;
}

Assistant:

void HTS_Label_load_from_fn(HTS_Label * label, size_t sampling_rate, size_t fperiod, const char *fn)
{
   HTS_File *fp = HTS_fopen_from_fn(fn, "r");
   HTS_Label_load(label, sampling_rate, fperiod, fp);
   HTS_fclose(fp);
}